

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<kj::AppendableFile,_std::nullptr_t> __thiscall
kj::Directory::appendFile(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  int line;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  AppendableFile *pAVar1;
  ulong in_R8;
  char *macroArgs;
  char *params;
  Own<kj::AppendableFile,_std::nullptr_t> OVar2;
  Fault f;
  _func_int **local_40;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x80))(&f);
  pAVar1 = extraout_RDX;
  if (local_40 != (_func_int **)0x0) goto LAB_001ecda2;
  if ((in_R8 & 1) == 0) {
    if ((in_R8 & 2) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x25a,FAILED,(char *)0x0,
                 "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                 (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                 &path_local);
    }
    else {
      params = "file does not exist";
      macroArgs = "\"file does not exist\", path";
      line = 600;
LAB_001ecd02:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,line,FAILED,(char *)0x0,macroArgs,(char (*) [20])params,&path_local);
    }
  }
  else {
    if ((in_R8 & 2) == 0) {
      params = "file already exists";
      macroArgs = "\"file already exists\", path";
      line = 0x256;
      goto LAB_001ecd02;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x25d,FAILED,(char *)0x0,
               "\"tryAppendFile() returned null despite no preconditions\", path",
               (char (*) [55])"tryAppendFile() returned null despite no preconditions",&path_local);
  }
  kj::_::Debug::Fault::~Fault(&f);
  clock = nullClock();
  newInMemoryFile((kj *)&f,clock);
  local_40 = (_func_int **)operator_new(0x20);
  *local_40 = (_func_int *)&PTR_getFd_00280d88;
  local_40[1] = (_func_int *)&PTR__AppendableFileImpl_00280de0;
  local_40[2] = (_func_int *)f.exception;
  local_40[3] = (_func_int *)0x0;
  f.exception = (Exception *)
                &kj::_::HeapDisposer<kj::(anonymous_namespace)::AppendableFileImpl>::instance;
  pAVar1 = extraout_RDX_00;
LAB_001ecda2:
  (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
  this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = local_40;
  OVar2.ptr = pAVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<AppendableFile> Directory::appendFile(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryAppendFile(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryAppendFile() returned null despite no preconditions", path) { break; }